

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O3

void Wln_RetAddToMoves(Wln_Ret_t *p,Vec_Int_t *vSet,int Delay,int fForward,int nMoves,
                      int fSkipSimple,int fVerbose)

{
  Vec_Int_t *p_00;
  uint uVar1;
  uint uVar2;
  Wln_Ntk_t *pWVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  
  if (vSet == (Vec_Int_t *)0x0) {
    printf("Move %4d : Recording initial state     (delay = %6d)\n",(ulong)(uint)nMoves,
           (ulong)(uint)Delay);
    Vec_IntPush(&p->vMoves,Delay);
    Vec_IntPush(&p->vMoves,0);
    return;
  }
  pcVar5 = "forward ";
  if (fForward == 0) {
    pcVar5 = "backward";
  }
  printf("Move %4d : Recording %s retiming (delay = %6d) :",(ulong)(uint)nMoves,pcVar5,
         (ulong)(uint)Delay);
  p_00 = &p->vMoves;
  Vec_IntPush(p_00,Delay);
  if (0 < vSet->nSize) {
    lVar6 = 0;
    do {
      uVar1 = vSet->pArray[lVar6];
      lVar7 = (long)(int)uVar1;
      if ((lVar7 < 0) || (pWVar3 = p->pNtk, (pWVar3->vNameIds).nSize <= (int)uVar1)) {
LAB_0038a297:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = (pWVar3->vNameIds).pArray[lVar7];
      if (fSkipSimple == 0) {
LAB_0038a1ca:
        uVar4 = -uVar2;
        if (fForward == 0) {
          uVar4 = uVar2;
        }
        Vec_IntPush(p_00,uVar4);
        if (fVerbose != 0) {
          uVar2 = -uVar1;
          if (fForward == 0) {
            uVar2 = uVar1;
          }
          printf(" %d (NameID = %d)  ",(ulong)uVar2,(ulong)uVar4);
        }
      }
      else {
        if ((pWVar3->vTypes).nSize <= (int)uVar1) goto LAB_0038a297;
        uVar4 = (pWVar3->vTypes).pArray[lVar7] - 0x59;
        if ((3 < uVar4) || (uVar4 == 1)) goto LAB_0038a1ca;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < vSet->nSize);
  }
  Vec_IntPush(p_00,0);
  if (fVerbose == 0) {
    printf(" %3d retimed objects",(ulong)(uint)vSet->nSize);
  }
  putchar(10);
  return;
}

Assistant:

void Wln_RetAddToMoves( Wln_Ret_t * p, Vec_Int_t * vSet, int Delay, int fForward, int nMoves, int fSkipSimple, int fVerbose )
{
    int i, iObj;
    if ( vSet == NULL )
    {
        printf( "Move %4d : Recording initial state     (delay = %6d)\n", nMoves, Delay );
        Vec_IntPushTwo( &p->vMoves, Delay, 0 );
        return;
    }
    printf( "Move %4d : Recording %s retiming (delay = %6d) :", nMoves, fForward ? "forward " : "backward", Delay );
    Vec_IntPush( &p->vMoves, Delay );
    Vec_IntForEachEntry( vSet, iObj, i )
    {
        int NameId = Vec_IntEntry( &p->pNtk->vNameIds, iObj );
        if ( fSkipSimple && (Wln_ObjIsFf(p->pNtk, iObj) || Wln_ObjType(p->pNtk, iObj) == ABC_OPER_SLICE || Wln_ObjType(p->pNtk, iObj) == ABC_OPER_CONCAT) )
            continue;
        Vec_IntPush( &p->vMoves, fForward ? -NameId : NameId );
        if ( fVerbose )
            printf( " %d (NameID = %d)  ", fForward ? -iObj : iObj, fForward ? -NameId : NameId );
    }
    Vec_IntPush( &p->vMoves, 0 );
    if ( !fVerbose )
        printf( " %3d retimed objects", Vec_IntSize(vSet) );
    printf( "\n" );
}